

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall Character::CheckQuestRules(Character *this)

{
  bool bVar1;
  reference ppVar2;
  element_type *peVar3;
  Quest *this_00;
  undefined1 local_40 [8];
  pair<const_short,_std::shared_ptr<Quest_Context>_> q;
  iterator __end1;
  iterator __begin1;
  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
  *__range1;
  Character *this_local;
  
  __end1 = std::
           map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
           ::begin(&this->quests);
  q.second.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
       ::end(&this->quests);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&q.second.
                                                  super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>::
             operator*(&__end1);
    std::pair<const_short,_std::shared_ptr<Quest_Context>_>::pair
              ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)local_40,ppVar2);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&q);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&q);
      this_00 = Quest_Context::GetQuest(peVar3);
      bVar1 = Quest::Disabled(this_00);
      if (!bVar1) {
        peVar3 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&q);
        EOPlus::Context::CheckRules(&peVar3->super_Context);
      }
    }
    std::pair<const_short,_std::shared_ptr<Quest_Context>_>::~pair
              ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)local_40);
    std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void Character::CheckQuestRules()
{
	UTIL_FOREACH(this->quests, q)
	{
		if (!q.second || q.second->GetQuest()->Disabled())
			continue;

		q.second->CheckRules();
	}
}